

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv_cwd(char *buffer,size_t *size)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  char scratch [257];
  
  if (size == (size_t *)0x0 || buffer == (char *)0x0) {
    return -0x16;
  }
  pcVar2 = getcwd(buffer,*size);
  if (pcVar2 == (char *)0x0) {
    piVar4 = __errno_location();
    if (*piVar4 != 0x22) {
      return -*piVar4;
    }
    pcVar2 = getcwd(scratch,0x101);
    buffer = scratch;
    if (pcVar2 == (char *)0x0) {
      return -*piVar4;
    }
  }
  sVar3 = strlen(buffer);
  *size = sVar3;
  if ((1 < sVar3) && (buffer[sVar3 - 1] == '/')) {
    *size = sVar3 - 1;
    buffer[sVar3 - 1] = '\0';
  }
  iVar1 = 0;
  if (buffer == scratch) {
    *size = *size + 1;
    iVar1 = -0x69;
  }
  return iVar1;
}

Assistant:

int uv_cwd(char* buffer, size_t* size) {
  char scratch[1 + UV__PATH_MAX];

  if (buffer == NULL || size == NULL)
    return UV_EINVAL;

  /* Try to read directly into the user's buffer first... */
  if (getcwd(buffer, *size) != NULL)
    goto fixup;

  if (errno != ERANGE)
    return UV__ERR(errno);

  /* ...or into scratch space if the user's buffer is too small
   * so we can report how much space to provide on the next try.
   */
  if (getcwd(scratch, sizeof(scratch)) == NULL)
    return UV__ERR(errno);

  buffer = scratch;

fixup:

  *size = strlen(buffer);

  if (*size > 1 && buffer[*size - 1] == '/') {
    *size -= 1;
    buffer[*size] = '\0';
  }

  if (buffer == scratch) {
    *size += 1;
    return UV_ENOBUFS;
  }

  return 0;
}